

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool openjtalk_speakToFileSjis(OpenJTalk *oj,char *textSjis,char *fileSjis)

{
  SpeakData *pSVar1;
  _Bool _Var2;
  char *pcVar3;
  FILE *__stream;
  char file_utf8 [260];
  char acStack_128 [264];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (((textSjis == (char *)0x0 || fileSjis == (char *)0x0) || (*fileSjis == '\0')) ||
       (*textSjis == '\0')) {
      oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
    }
    else {
      pcVar3 = convert_charset_path(fileSjis,CS_SHIFT_JIS,acStack_128,CS_UTF_8);
      if (pcVar3 == (char *)0x0) {
        return false;
      }
      __stream = fopen(acStack_128,"wb");
      if (__stream != (FILE *)0x0) {
        pcVar3 = convert_charset(textSjis,CS_SHIFT_JIS,CS_UTF_8);
        pSVar1 = g_psd;
        if (pcVar3 == (char *)0x0) {
          return false;
        }
        g_psd->sampling_frequency = 0;
        pSVar1->data = (short *)0x0;
        pSVar1->length = 0;
        _Var2 = Open_JTalk_synthesis(oj->open_jtalk,pcVar3,(FILE *)__stream,(FILE *)0x0);
        free(pcVar3);
        fclose(__stream);
        return _Var2;
      }
      oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
    }
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakToFileSjis(OpenJTalk *oj, const char *textSjis, const char *fileSjis)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (fileSjis == NULL || textSjis == NULL)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	if (strlen(fileSjis) == 0 || strlen(textSjis) == 0)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	FILE *wavfp = fopen(fileSjis, u8"wb");
#else
	char file_utf8[MAX_PATH];
	if (!sjistou8_path(fileSjis, file_utf8))
	{
		return false;
	}
	FILE *wavfp = fopen(file_utf8, "wb");
#endif
	if (!wavfp)
	{
		oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
		return false;
	}
	char *buf = sjistou8(textSjis);
	if (!buf)
	{
		return false;
	}
	bool result = generate_wavFile(oj, buf, wavfp);
	free(buf);
	fclose(wavfp);
	return result;
}